

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O3

void __thiscall
Potassco::ProgramOptions::anon_unknown_15::CfgFileParser::doParse(CfgFileParser *this)

{
  ParseContext *pPVar1;
  bool bVar2;
  Option *pOVar3;
  char cVar4;
  istream *piVar5;
  long lVar6;
  ulong uVar7;
  SyntaxError *this_00;
  undefined8 uVar8;
  char *__end;
  SharedOptPtr opt;
  string line;
  string sectionName;
  string sectionValue;
  IntrusiveSharedPtr<Potassco::ProgramOptions::Option> local_c0;
  Option *local_b8;
  long local_b0;
  undefined1 local_a8 [24];
  undefined1 local_90 [32];
  char *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Value *local_50;
  undefined8 local_48;
  undefined1 local_40;
  
  local_70 = local_68._M_local_buf + 8;
  bVar2 = false;
  local_68._M_allocated_capacity = 0;
  local_68._M_local_buf[8] = '\0';
  local_50 = (Value *)&local_40;
  local_48 = 0;
  local_40 = 0;
  local_c0.ptr_ = (Option *)0x0;
  local_90._0_8_ = local_90 + 0x10;
  local_90._8_8_ = 0;
  local_90[0x10] = '\0';
  local_a8._16_8_ = this;
LAB_00198cfa:
  do {
    piVar5 = *(istream **)(local_a8._16_8_ + 0x10);
    cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar5 + -0x18) + (char)piVar5);
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (piVar5,(string *)local_90,cVar4);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      if ((Option *)local_90._0_8_ != (Option *)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_);
      }
      if (bVar2) {
        pPVar1 = ((OptionParser *)local_a8._16_8_)->ctx_;
        (*pPVar1->_vptr_ParseContext[2])(local_90,pPVar1,local_70,3);
        if ((Option *)local_90._0_8_ != (Option *)0x0) {
          *(int *)local_90._0_8_ = *(int *)local_90._0_8_ + 1;
        }
        detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release(&local_c0);
        uVar8 = local_90._0_8_;
        local_c0.ptr_ = (Option *)local_90._0_8_;
        detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release
                  ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)local_90);
        if ((Option *)uVar8 != (Option *)0x0) {
          pPVar1 = ((OptionParser *)local_a8._16_8_)->ctx_;
          (*pPVar1->_vptr_ParseContext[4])(pPVar1,&local_c0,&local_50);
        }
      }
      detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release(&local_c0);
      if (local_50 != (Value *)&local_40) {
        operator_delete(local_50);
      }
      if (local_70 != local_68._M_local_buf + 8) {
        operator_delete(local_70);
      }
      return;
    }
    local_b8 = (Option *)local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8," \t","");
    lVar6 = std::__cxx11::string::find_first_not_of((char *)local_90,(ulong)local_b8,0);
    if (lVar6 != 0) {
      std::__cxx11::string::erase((ulong)local_90,0);
    }
    if (local_b8 != (Option *)local_a8) {
      operator_delete(local_b8);
    }
    local_b8 = (Option *)local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8," \t","");
    uVar7 = std::__cxx11::string::find_last_not_of
                      ((char *)local_90,(ulong)local_b8,0xffffffffffffffff);
    if (uVar7 != 0xffffffffffffffff) {
      if ((ulong)local_90._8_8_ <= uVar7) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
        goto LAB_00199151;
      }
      *(char *)(local_90._0_8_ + uVar7 + 1) = '\0';
      local_90._8_8_ = uVar7 + 1;
    }
    if (local_b8 != (Option *)local_a8) {
      operator_delete(local_b8);
    }
    if (local_90._8_8_ != 0) {
      lVar6 = std::__cxx11::string::find((char *)local_90,0x1b0505,0);
      if (lVar6 != 0) {
        lVar6 = std::__cxx11::string::find((char *)local_90,0x1b120b,0);
        if (lVar6 == -1) {
          if (!bVar2) {
LAB_00199151:
            this_00 = (SyntaxError *)__cxa_allocate_exception(0x38);
            SyntaxError::SyntaxError(this_00,invalid_format,(string *)local_90);
            __cxa_throw(this_00,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
          }
          std::__cxx11::string::append((char *)&local_50);
          std::__cxx11::string::_M_append((char *)&local_50,local_90._0_8_);
        }
        else {
          if (bVar2) {
            pPVar1 = ((OptionParser *)local_a8._16_8_)->ctx_;
            (*pPVar1->_vptr_ParseContext[2])((string *)&local_b8,pPVar1,local_70,3);
            if (local_b8 != (Option *)0x0) {
              (local_b8->super_RefCountable).refCount_ =
                   (local_b8->super_RefCountable).refCount_ + 1;
            }
            detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release(&local_c0);
            pOVar3 = local_b8;
            local_c0.ptr_ = local_b8;
            detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release
                      ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)&local_b8);
            if (pOVar3 != (Option *)0x0) {
              pPVar1 = ((OptionParser *)local_a8._16_8_)->ctx_;
              (*pPVar1->_vptr_ParseContext[4])(pPVar1,&local_c0,(string *)&local_50);
            }
          }
          local_b8 = (Option *)local_a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"=","");
          lVar6 = std::__cxx11::string::find((char *)local_90,(ulong)local_b8,0);
          std::__cxx11::string::assign((string *)&local_70,(ulong)local_90,0);
          if (lVar6 != -1) {
            std::__cxx11::string::assign((string *)&local_50,(ulong)local_90,lVar6 + local_b0);
          }
          if (local_b8 != (Option *)local_a8) {
            operator_delete(local_b8);
          }
          local_b8 = (Option *)local_a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8," \t","");
          uVar7 = std::__cxx11::string::find_last_not_of
                            ((char *)&local_70,(ulong)local_b8,0xffffffffffffffff);
          if (uVar7 != 0xffffffffffffffff) {
            if (local_68._M_allocated_capacity <= uVar7) {
              uVar8 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                 "basic_string::erase");
              if ((Option *)local_90._0_8_ != (Option *)(local_90 + 0x10)) {
                operator_delete((void *)local_90._0_8_);
              }
              detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release(&local_c0);
              if (local_50 != (Value *)&local_40) {
                operator_delete(local_50);
              }
              if (local_70 != local_68._M_local_buf + 8) {
                operator_delete(local_70);
              }
              _Unwind_Resume(uVar8);
            }
            local_70[uVar7 + 1] = '\0';
            local_68._M_allocated_capacity = uVar7 + 1;
          }
          if (local_b8 != (Option *)local_a8) {
            operator_delete(local_b8);
          }
          local_b8 = (Option *)local_a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8," \t\n","");
          lVar6 = std::__cxx11::string::find_first_not_of((char *)&local_50,(ulong)local_b8,0);
          if (lVar6 != 0) {
            std::__cxx11::string::erase((ulong)&local_50,0);
          }
          if (local_b8 != (Option *)local_a8) {
            operator_delete(local_b8);
          }
          bVar2 = true;
        }
        goto LAB_00198cfa;
      }
    }
    if (bVar2) {
      pPVar1 = ((OptionParser *)local_a8._16_8_)->ctx_;
      (*pPVar1->_vptr_ParseContext[2])((string *)&local_b8,pPVar1,local_70,3);
      if (local_b8 != (Option *)0x0) {
        (local_b8->super_RefCountable).refCount_ = (local_b8->super_RefCountable).refCount_ + 1;
      }
      detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release(&local_c0);
      pOVar3 = local_b8;
      local_c0.ptr_ = local_b8;
      detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release
                ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)&local_b8);
      bVar2 = false;
      if (pOVar3 != (Option *)0x0) {
        pPVar1 = ((OptionParser *)local_a8._16_8_)->ctx_;
        bVar2 = false;
        (*pPVar1->_vptr_ParseContext[4])(pPVar1,&local_c0,&local_50);
      }
    }
  } while( true );
}

Assistant:

void doParse() {
					 int lineNr = 0;
					 std::string sectionName;      // current section name
					 std::string sectionValue;     // current section value
					 bool inSection = false;       // true if multi line section value
					 FindType ft = OptionContext::find_name_or_prefix;
					 SharedOptPtr opt;
					 // reads the config file.
					 // A config file may only contain empty lines, single line comments or
					 // sections structured in a name = value fashion.
					 // value can span multiple lines, but parts in different lines than name
					 // must not contain a '='-Character.
					 for (std::string line; std::getline(in_, line);) {
						 ++lineNr;
						 trimLeft(line);
						 trimRight(line);

						 if (line.empty() || line.find("#") == 0) {
							 // An empty line or single line comment stops a multi line section value.
							 if (inSection) {
								 if ((opt = getOption(sectionName.c_str(), ft)).get())
									 addOptionValue(opt, sectionValue);
								 inSection = false;
							 }
							 continue;
						 }
						 std::string::size_type pos;
						 if ((pos = line.find("=")) != std::string::npos) {
							 // A new section terminates a multi line section value.
							 // First process the current section value...
							 if (inSection && (opt = getOption(sectionName.c_str(), ft)).get()) {
								 addOptionValue(opt, sectionValue);
							 }
							 // ...then save the new section's value.
							 splitHalf(line, "=", sectionName, sectionValue);
							 trimRight(sectionName);
							 trimLeft(sectionValue, " \t\n");
							 inSection = true;
						 }
						 else if (inSection) {
							 sectionValue += " ";
							 sectionValue += line;
						 }
						 else {
							 throw SyntaxError(SyntaxError::invalid_format, line);
						 }
					 }
					 if (inSection) { // file does not end with an empty line
						 if ((opt = getOption(sectionName.c_str(), ft)).get())
							 addOptionValue(opt, sectionValue);
					 }
				 }